

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

bool __thiscall kj::String::operator==(String *this,String *other)

{
  bool bVar1;
  ArrayPtr<const_char> local_20;
  ArrayPtr<const_char> local_10;
  
  local_20.size_ = (this->content).size_;
  local_10.ptr = "";
  local_20.ptr = "";
  if (local_20.size_ != 0) {
    local_20.ptr = (this->content).ptr;
  }
  local_20.size_ = local_20.size_ + (local_20.size_ == 0);
  local_10.size_ = (other->content).size_;
  if (local_10.size_ != 0) {
    local_10.ptr = (other->content).ptr;
  }
  local_10.size_ = local_10.size_ + (local_10.size_ == 0);
  bVar1 = ArrayPtr<const_char>::operator==(&local_20,&local_10);
  return bVar1;
}

Assistant:

inline bool operator==(decltype(nullptr)) const { return size_ == 0; }